

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::TransitionOrVerifyTextureState
          (DeviceContextVkImpl *this,TextureVkImpl *Texture,
          RESOURCE_STATE_TRANSITION_MODE TransitionMode,RESOURCE_STATE RequiredState,
          VkImageLayout ExpectedLayout,char *OperationName)

{
  VkImageLayout VVar1;
  char (*Args_1) [38];
  int iVar2;
  undefined7 in_register_00000011;
  string msg;
  string local_48;
  
  iVar2 = (int)CONCAT71(in_register_00000011,TransitionMode);
  if (iVar2 != 2) {
    if (iVar2 == 1) {
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
          (RenderPassVkImpl *)0x0) {
        FormatString<char[55]>
                  (&local_48,(char (*) [55])"State transitions are not allowed inside a render pass"
                  );
        DebugAssertionFailed
                  (local_48._M_dataplus._M_p,"TransitionOrVerifyTextureState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xc1e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if ((Texture->super_TextureBase<Diligent::EngineVkImplTraits>).m_State !=
          RESOURCE_STATE_UNKNOWN) {
        Args_1 = (char (*) [38])(ulong)RequiredState;
        TransitionTextureState
                  (this,Texture,RESOURCE_STATE_UNKNOWN,RequiredState,
                   STATE_TRANSITION_FLAG_UPDATE_STATE,(VkImageSubresourceRange *)0x0);
        VVar1 = TextureVkImpl::GetLayout(Texture);
        if (VVar1 != ExpectedLayout) {
          FormatString<char[26],char[38]>
                    (&local_48,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"Texture.GetLayout() == ExpectedLayout",Args_1);
          DebugAssertionFailed
                    (local_48._M_dataplus._M_p,"TransitionOrVerifyTextureState",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xc22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    return;
  }
  DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyTextureState
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Texture,RequiredState,
             OperationName);
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionOrVerifyTextureState(TextureVkImpl&                 Texture,
                                                         RESOURCE_STATE_TRANSITION_MODE TransitionMode,
                                                         RESOURCE_STATE                 RequiredState,
                                                         VkImageLayout                  ExpectedLayout,
                                                         const char*                    OperationName)
{
    if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
    {
        VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
        if (Texture.IsInKnownState())
        {
            TransitionTextureState(Texture, RESOURCE_STATE_UNKNOWN, RequiredState, STATE_TRANSITION_FLAG_UPDATE_STATE);
            VERIFY_EXPR(Texture.GetLayout() == ExpectedLayout);
        }
    }
#ifdef DILIGENT_DEVELOPMENT
    else if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
    {
        DvpVerifyTextureState(Texture, RequiredState, OperationName);
    }
#endif
}